

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddDecomp.c
# Opt level: O1

int Cudd_bddApproxConjDecomp(DdManager *dd,DdNode *f,DdNode ***conjuncts)

{
  int *piVar1;
  int numVars;
  DdNode *pDVar2;
  DdNode *c;
  DdNode *c_00;
  DdNode **ppDVar3;
  
  numVars = Cudd_SupportSize(dd,f);
  pDVar2 = Cudd_RemapOverApprox(dd,f,numVars,0,1.0);
  if (pDVar2 == (DdNode *)0x0) {
    return 0;
  }
  piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  c = Cudd_bddSqueeze(dd,f,pDVar2);
  if (c != (DdNode *)0x0) {
    piVar1 = (int *)(((ulong)c & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    Cudd_RecursiveDeref(dd,pDVar2);
    c_00 = Cudd_bddLICompaction(dd,f,c);
    pDVar2 = c;
    if (c_00 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)c_00 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar2 = Cudd_bddLICompaction(dd,c,c_00);
      if (pDVar2 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,c);
        if (pDVar2 == dd->one) {
          Cudd_RecursiveDeref(dd,pDVar2);
          ppDVar3 = (DdNode **)malloc(8);
          *conjuncts = ppDVar3;
          pDVar2 = c_00;
          if (ppDVar3 != (DdNode **)0x0) {
            *ppDVar3 = c_00;
            return 1;
          }
        }
        else if (c_00 == dd->one) {
          Cudd_RecursiveDeref(dd,c_00);
          ppDVar3 = (DdNode **)malloc(8);
          *conjuncts = ppDVar3;
          if (ppDVar3 != (DdNode **)0x0) {
            *ppDVar3 = pDVar2;
            return 1;
          }
        }
        else {
          ppDVar3 = (DdNode **)malloc(0x10);
          *conjuncts = ppDVar3;
          if (ppDVar3 != (DdNode **)0x0) {
            *ppDVar3 = pDVar2;
            ppDVar3[1] = c_00;
            return 2;
          }
          Cudd_RecursiveDeref(dd,pDVar2);
          pDVar2 = c_00;
        }
        Cudd_RecursiveDeref(dd,pDVar2);
        dd->errorCode = CUDD_MEMORY_OUT;
        return 0;
      }
      Cudd_RecursiveDeref(dd,c);
      pDVar2 = c_00;
    }
  }
  Cudd_RecursiveDeref(dd,pDVar2);
  return 0;
}

Assistant:

int
Cudd_bddApproxConjDecomp(
  DdManager * dd /* manager */,
  DdNode * f /* function to be decomposed */,
  DdNode *** conjuncts /* address of the first factor */)
{
    DdNode *superset1, *superset2, *glocal, *hlocal;
    int nvars = Cudd_SupportSize(dd,f);

    /* Find a tentative first factor by overapproximation and minimization. */
    superset1 = Cudd_RemapOverApprox(dd,f,nvars,0,1.0);
    if (superset1 == NULL) return(0);
    cuddRef(superset1);
    superset2 = Cudd_bddSqueeze(dd,f,superset1);
    if (superset2 == NULL) {
        Cudd_RecursiveDeref(dd,superset1);
        return(0);
    }
    cuddRef(superset2);
    Cudd_RecursiveDeref(dd,superset1);

    /* Compute the second factor by minimization. */
    hlocal = Cudd_bddLICompaction(dd,f,superset2);
    if (hlocal == NULL) {
        Cudd_RecursiveDeref(dd,superset2);
        return(0);
    }
    cuddRef(hlocal);

    /* Refine the first factor by minimization. If h turns out to be f, this
    ** step guarantees that g will be 1. */
    glocal = Cudd_bddLICompaction(dd,superset2,hlocal);
    if (glocal == NULL) {
        Cudd_RecursiveDeref(dd,superset2);
        Cudd_RecursiveDeref(dd,hlocal);
        return(0);
    }
    cuddRef(glocal);
    Cudd_RecursiveDeref(dd,superset2);

    if (glocal != DD_ONE(dd)) {
        if (hlocal != DD_ONE(dd)) {
            *conjuncts = ABC_ALLOC(DdNode *,2);
            if (*conjuncts == NULL) {
                Cudd_RecursiveDeref(dd,glocal);
                Cudd_RecursiveDeref(dd,hlocal);
                dd->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            (*conjuncts)[0] = glocal;
            (*conjuncts)[1] = hlocal;
            return(2);
        } else {
            Cudd_RecursiveDeref(dd,hlocal);
            *conjuncts = ABC_ALLOC(DdNode *,1);
            if (*conjuncts == NULL) {
                Cudd_RecursiveDeref(dd,glocal);
                dd->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            (*conjuncts)[0] = glocal;
            return(1);
        }
    } else {
        Cudd_RecursiveDeref(dd,glocal);
        *conjuncts = ABC_ALLOC(DdNode *,1);
        if (*conjuncts == NULL) {
            Cudd_RecursiveDeref(dd,hlocal);
            dd->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        (*conjuncts)[0] = hlocal;
        return(1);
    }

}